

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall
ON_SubDMesh::GetEdgeCenterPointAndNormal
          (ON_SubDMesh *this,ON_SubDEdge *edge,uint edge_face_index,double *P,double *N)

{
  byte bVar1;
  element_type *peVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ON_SubDEdge *pOVar9;
  ON_SubDVertex *pOVar10;
  ON__UINT_PTR OVar11;
  ON_SubDVertex *pOVar12;
  long lVar13;
  long lVar14;
  uint *puVar15;
  ON_SubDMeshFragment *this_00;
  bool bVar16;
  uint local_64;
  ON_SubDEdgePtr local_60;
  uint local_54;
  ON_SubDFace *local_50;
  uint local_44;
  double *local_40;
  double *local_38;
  
  dVar5 = ON_DBL_QNAN;
  if (P != (double *)0x0) {
    *P = ON_DBL_QNAN;
    P[1] = dVar5;
    P[2] = dVar5;
  }
  dVar5 = ON_DBL_QNAN;
  if (N != (double *)0x0) {
    *N = ON_DBL_QNAN;
    N[1] = dVar5;
    N[2] = dVar5;
  }
  if ((edge != (ON_SubDEdge *)0x0) &&
     (local_50 = ON_SubDEdge::Face(edge,edge_face_index), local_50 != (ON_SubDFace *)0x0)) {
    uVar7 = ON_SubDFace::EdgeArrayIndex(local_50,edge);
    uVar8 = ON_SubDFace::EdgeCount(local_50);
    if (uVar7 < uVar8) {
      peVar2 = (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar2 == (element_type *)0x0) {
        this_00 = (ON_SubDMeshFragment *)0x0;
      }
      else {
        this_00 = peVar2->m_first_fragment;
      }
      for (; (this_00 != (ON_SubDMeshFragment *)0x0 && (this_00->m_face != local_50));
          this_00 = this_00->m_next_fragment) {
      }
      local_64 = 0xffffffff;
      bVar16 = this_00 == (ON_SubDMeshFragment *)0x0;
      local_40 = P;
      local_38 = N;
      if ((!bVar16) && (local_44 = uVar7, this_00->m_face == local_50)) {
        do {
          local_54 = ON_SubDMeshFragment::FaceCornerIndex(this_00);
          uVar7 = 0;
          local_64 = 0xffffffff;
          do {
            local_60 = ON_SubDMeshFragment::SubDEdgePtr(this_00,uVar7);
            pOVar9 = ON_SubDEdgePtr::Edge(&local_60);
            if (((pOVar9 == edge) && (bVar1 = (this_00->m_grid).m_side_segment_count, bVar1 != 0))
               && (puVar15 = (this_00->m_grid).m_S, puVar15 != (uint *)0x0)) {
              if (local_54 == 0xffffffff) {
                bVar6 = ON_SubDMeshFragment::IsFullFaceFragment(this_00);
                if (bVar6) {
                  uVar8 = (uint)(bVar1 >> 1) + uVar7 * bVar1;
                  goto LAB_006165d6;
                }
              }
              else {
                pOVar10 = ON_SubDMeshFragment::SubDVertex(this_00,uVar7);
                if (pOVar10 != (ON_SubDVertex *)0x0) {
                  OVar11 = ON_SubDFace::EdgeDirection(local_50,local_44);
                  pOVar12 = ON_SubDEdge::Vertex(edge,(uint)(OVar11 != 0));
                  uVar7 = uVar7 + (pOVar10 == pOVar12);
                  puVar15 = (this_00->m_grid).m_S;
                  uVar8 = bVar1 * uVar7;
LAB_006165d6:
                  local_64 = puVar15[uVar8];
                }
              }
            }
          } while ((pOVar9 != edge) && (uVar7 = uVar7 + 1, uVar7 < 4));
          if ((local_54 == 0xffffffff) || (local_64 != 0xffffffff)) break;
          this_00 = this_00->m_next_fragment;
          local_64 = 0xffffffff;
          bVar16 = this_00 == (ON_SubDMeshFragment *)0x0;
          if ((bVar16) || (this_00->m_face != local_50)) break;
        } while( true );
      }
      if (!bVar16) {
        pdVar3 = this_00->m_P;
        if (pdVar3 == (double *)0x0) {
          return false;
        }
        if (this_00->m_P_stride < 3) {
          return false;
        }
        if ((this_00->m_vertex_count_etc & 0x1fff) <= local_64) {
          return false;
        }
        lVar14 = this_00->m_N_stride * (ulong)local_64;
        pdVar4 = this_00->m_N;
        if (local_40 != (double *)0x0) {
          lVar13 = this_00->m_P_stride * (ulong)local_64;
          *local_40 = pdVar3[lVar13];
          local_40[1] = pdVar3[lVar13 + 1];
          local_40[2] = pdVar3[lVar13 + 2];
        }
        if (local_38 == (double *)0x0) {
          return true;
        }
        *local_38 = pdVar4[lVar14];
        local_38[1] = pdVar4[lVar14 + 1];
        local_38[2] = pdVar4[lVar14 + 2];
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDMesh::GetEdgeCenterPointAndNormal(
  const class ON_SubDEdge* edge,
  unsigned int edge_face_index,
  double* P,
  double* N
) const
{
  if (nullptr != P)
  {
    P[0] = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (nullptr != N)
  {
    N[0] = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  if (nullptr == edge)
    return false;
  const ON_SubDFace* face = edge->Face(edge_face_index);
  if (nullptr == face)
    return false;
  const unsigned int fei = face->EdgeArrayIndex(edge);
  if (fei >= face->EdgeCount())
    return false;

  unsigned int P_dex = ON_UNSET_UINT_INDEX;

  bool bIsPartialFragment = false;
  const ON_SubDMeshFragment* fragment = nullptr;
  for (
    fragment =  FaceFragment(face);
    nullptr != fragment && fragment->m_face == face;
    fragment = bIsPartialFragment ? fragment->m_next_fragment : nullptr
    )
  {
    bIsPartialFragment = fragment->IsFaceCornerFragment();
    for (unsigned int grid_side_index = 0; grid_side_index < 4; grid_side_index++)
    {
      const ON_SubDEdge* grid_side_edge = fragment->SubDEdge(grid_side_index);
      if (edge != grid_side_edge)
        continue;
      const unsigned int n = fragment->m_grid.m_side_segment_count;
      if (n <= 0 || nullptr == fragment->m_grid.m_S)
        break;
      if (bIsPartialFragment)
      {
        const ON_SubDVertex* v = fragment->SubDVertex(grid_side_index);
        if (nullptr != v)
        {
          const unsigned int evi = (0 == face->EdgeDirection(fei)) ? 0U : 1U;
          if (v == edge->Vertex(evi))
            grid_side_index++;
          P_dex = fragment->m_grid.m_S[grid_side_index*n];
        }
      }
      else if (fragment->IsFullFaceFragment())
      {
        P_dex = fragment->m_grid.m_S[grid_side_index*n + n / 2];
      }
      break;
    }
    if (false == bIsPartialFragment || ON_UNSET_UINT_INDEX != P_dex)
      break;
  }
  if (nullptr == fragment)
    return false;
  if (P_dex >= fragment->PointCount())
    return false;
  const double* fragment_P = fragment->m_P + (P_dex * fragment->m_P_stride);
  const double* fragment_N = fragment->m_N + (P_dex * fragment->m_N_stride);
  if (nullptr != P)
  {
    P[0] = fragment_P[0];
    P[1] = fragment_P[1];
    P[2] = fragment_P[2];
  }
  if (nullptr != N)
  {
    N[0] = fragment_N[0];
    N[1] = fragment_N[1];
    N[2] = fragment_N[2];
  }
  return true;
}